

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

char * format_telnet_command(SockAddr *addr,int port,Conf *conf,uint *flags_out)

{
  BinarySink *bs;
  byte bVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  strbuf *buf_o;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  uchar uVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  char dest [512];
  uint local_274;
  char local_238 [520];
  
  pcVar4 = conf_get_str(conf,0x12);
  buf_o = strbuf_new();
  if (*pcVar4 == '\0') {
    local_274 = 0;
    iVar12 = 0;
    iVar14 = 0;
  }
  else {
    bs = buf_o->binarysink_;
    iVar12 = 0;
    local_274 = 0;
    pcVar5 = pcVar4;
    do {
      lVar11 = 0;
      iVar14 = iVar12;
      while( true ) {
        iVar14 = iVar14 + 1;
        cVar9 = pcVar4[lVar11 + iVar12];
        iVar10 = (int)lVar11;
        if (cVar9 == '\0') {
          iVar14 = iVar10 + iVar12;
          goto LAB_0013c610;
        }
        if ((cVar9 == '%') || (cVar9 == '\\')) break;
        lVar11 = lVar11 + 1;
      }
      if (iVar10 != 0) {
        BinarySink_put_data(bs,pcVar5,(long)iVar10);
      }
      iVar13 = iVar12 + iVar10 + 1;
      bVar1 = pcVar4[iVar13];
      if (bVar1 == 0) {
        iVar14 = iVar12 + iVar10;
        iVar12 = iVar10 + iVar12;
        iVar14 = iVar14 + 1;
        break;
      }
      if (pcVar4[lVar11 + iVar12] == '\\') {
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x25) goto LAB_0013c2be;
          if (bVar1 == 0x58) {
LAB_0013c3ea:
            pcVar5 = pcVar4 + (long)iVar14 + 1;
            bVar7 = false;
            cVar9 = '\0';
            while( true ) {
              cVar2 = *pcVar5;
              if ((byte)(cVar2 - 0x30U) < 10) {
                uVar8 = cVar2 + cVar9 + 0xd0;
              }
              else if ((byte)(cVar2 + 0x9fU) < 6) {
                uVar8 = cVar2 + cVar9 + 0xa9;
              }
              else {
                if (5 < (byte)(cVar2 + 0xbfU)) {
                  uVar8 = '\\';
                  goto LAB_0013c540;
                }
                uVar8 = cVar2 + cVar9 + 0xc9;
              }
              if (bVar7) break;
              cVar9 = uVar8 << 4;
              pcVar5 = pcVar5 + 1;
              bVar7 = true;
            }
            BinarySink_put_byte(bs,uVar8);
            iVar12 = iVar12 + iVar10 + 4;
            goto LAB_0013c2d5;
          }
          if (bVar1 != 0x5c) goto LAB_0013c48c;
          uVar8 = '\\';
LAB_0013c2cb:
          BinarySink_put_byte(bs,uVar8);
        }
        else {
          if (bVar1 < 0x74) {
            if (bVar1 == 0x6e) {
              uVar8 = '\n';
            }
            else {
              if (bVar1 != 0x72) goto LAB_0013c48c;
              uVar8 = '\r';
            }
            goto LAB_0013c2cb;
          }
          if (bVar1 == 0x74) {
            uVar8 = '\t';
            goto LAB_0013c2cb;
          }
          if (bVar1 == 0x78) goto LAB_0013c3ea;
LAB_0013c48c:
          BinarySink_put_data(bs,pcVar4 + lVar11 + iVar12,2);
        }
        iVar12 = iVar12 + iVar10 + 2;
      }
      else {
        if (bVar1 == 0x25) {
LAB_0013c2be:
          uVar8 = '%';
          goto LAB_0013c2cb;
        }
        pcVar5 = pcVar4 + iVar13;
        iVar14 = strncasecmp(pcVar5,"host",4);
        if (iVar14 == 0) {
          sk_getaddr(addr,local_238,0x200);
          sVar6 = strlen(local_238);
          BinarySink_put_data(bs,local_238,sVar6);
LAB_0013c4e4:
          iVar12 = iVar12 + iVar10 + 5;
        }
        else {
          iVar14 = strncasecmp(pcVar5,"port",4);
          if (iVar14 == 0) {
            BinarySink_put_fmt(bs,"%d",(ulong)(uint)port);
            goto LAB_0013c4e4;
          }
          iVar14 = strncasecmp(pcVar5,"user",4);
          if (iVar14 == 0) {
            pcVar5 = conf_get_str(conf,0x10);
            sVar6 = strlen(pcVar5);
            BinarySink_put_data(bs,pcVar5,sVar6);
            iVar12 = iVar12 + iVar10 + 5;
            local_274 = local_274 | *pcVar5 == '\0';
          }
          else {
            iVar14 = strncasecmp(pcVar5,"pass",4);
            if (iVar14 == 0) {
              pcVar5 = conf_get_str(conf,0x11);
              sVar6 = strlen(pcVar5);
              BinarySink_put_data(bs,pcVar5,sVar6);
              iVar12 = iVar12 + iVar10 + 5;
              if (*pcVar5 == '\0') {
                local_274 = local_274 | 2;
              }
            }
            else {
              iVar14 = strncasecmp(pcVar5,"proxyhost",9);
              if (iVar14 == 0) {
                pcVar5 = conf_get_str(conf,0xe);
                sVar6 = strlen(pcVar5);
                BinarySink_put_data(bs,pcVar5,sVar6);
              }
              else {
                iVar14 = strncasecmp(pcVar5,"proxyport",9);
                if (iVar14 != 0) {
                  uVar8 = '%';
LAB_0013c540:
                  BinarySink_put_byte(bs,uVar8);
                  iVar12 = iVar13;
                  goto LAB_0013c2d5;
                }
                uVar3 = conf_get_int(conf,0xf);
                BinarySink_put_fmt(bs,"%d",(ulong)uVar3);
              }
              iVar12 = iVar12 + iVar10 + 10;
            }
          }
        }
      }
LAB_0013c2d5:
      pcVar5 = pcVar4 + iVar12;
      iVar14 = iVar12;
    } while (pcVar4[iVar12] != '\0');
  }
LAB_0013c610:
  if (iVar14 - iVar12 != 0) {
    BinarySink_put_data(buf_o->binarysink_,pcVar4 + iVar12,(long)(iVar14 - iVar12));
  }
  if (flags_out != (uint *)0x0) {
    *flags_out = local_274;
  }
  pcVar4 = strbuf_to_str(buf_o);
  return pcVar4;
}

Assistant:

char *format_telnet_command(SockAddr *addr, int port, Conf *conf,
                            unsigned *flags_out)
{
    char *fmt = conf_get_str(conf, CONF_proxy_telnet_command);
    int so = 0, eo = 0;
    strbuf *buf = strbuf_new();
    unsigned flags = 0;

    /* we need to escape \\, \%, \r, \n, \t, \x??, \0???,
     * %%, %host, %port, %user, and %pass
     */

    while (fmt[eo] != 0) {

        /* scan forward until we hit end-of-line,
         * or an escape character (\ or %) */
        while (fmt[eo] != 0 && fmt[eo] != '%' && fmt[eo] != '\\')
            eo++;

        /* if we hit eol, break out of our escaping loop */
        if (fmt[eo] == 0) break;

        /* if there was any unescaped text before the escape
         * character, send that now */
        if (eo != so)
            put_data(buf, fmt + so, eo - so);

        so = eo++;

        /* if the escape character was the last character of
         * the line, we'll just stop and send it. */
        if (fmt[eo] == 0) break;

        if (fmt[so] == '\\') {

            /* we recognize \\, \%, \r, \n, \t, \x??.
             * anything else, we just send unescaped (including the \).
             */

            switch (fmt[eo]) {

              case '\\':
                put_byte(buf, '\\');
                eo++;
                break;

              case '%':
                put_byte(buf, '%');
                eo++;
                break;

              case 'r':
                put_byte(buf, '\r');
                eo++;
                break;

              case 'n':
                put_byte(buf, '\n');
                eo++;
                break;

              case 't':
                put_byte(buf, '\t');
                eo++;
                break;

              case 'x':
              case 'X': {
                /* escaped hexadecimal value (ie. \xff) */
                unsigned char v = 0;
                int i = 0;

                for (;;) {
                  eo++;
                  if (fmt[eo] >= '0' && fmt[eo] <= '9')
                      v += fmt[eo] - '0';
                  else if (fmt[eo] >= 'a' && fmt[eo] <= 'f')
                      v += fmt[eo] - 'a' + 10;
                  else if (fmt[eo] >= 'A' && fmt[eo] <= 'F')
                      v += fmt[eo] - 'A' + 10;
                  else {
                    /* non hex character, so we abort and just
                     * send the whole thing unescaped (including \x)
                     */
                    put_byte(buf, '\\');
                    eo = so + 1;
                    break;
                  }

                  /* we only extract two hex characters */
                  if (i == 1) {
                    put_byte(buf, v);
                    eo++;
                    break;
                  }

                  i++;
                  v <<= 4;
                }
                break;
              }

              default:
                put_data(buf, fmt + so, 2);
                eo++;
                break;
            }
        } else {

            /* % escape. we recognize %%, %host, %port, %user, %pass.
             * %proxyhost, %proxyport. Anything else we just send
             * unescaped (including the %).
             */

            if (fmt[eo] == '%') {
                put_byte(buf, '%');
                eo++;
            }
            else if (strnicmp(fmt + eo, "host", 4) == 0) {
                char dest[512];
                sk_getaddr(addr, dest, lenof(dest));
                put_data(buf, dest, strlen(dest));
                eo += 4;
            }
            else if (strnicmp(fmt + eo, "port", 4) == 0) {
                put_fmt(buf, "%d", port);
                eo += 4;
            }
            else if (strnicmp(fmt + eo, "user", 4) == 0) {
                const char *username = conf_get_str(conf, CONF_proxy_username);
                put_data(buf, username, strlen(username));
                eo += 4;
                if (!*username)
                    flags |= TELNET_CMD_MISSING_USERNAME;
            }
            else if (strnicmp(fmt + eo, "pass", 4) == 0) {
                const char *password = conf_get_str(conf, CONF_proxy_password);
                put_data(buf, password, strlen(password));
                eo += 4;
                if (!*password)
                    flags |= TELNET_CMD_MISSING_PASSWORD;
            }
            else if (strnicmp(fmt + eo, "proxyhost", 9) == 0) {
                const char *host = conf_get_str(conf, CONF_proxy_host);
                put_data(buf, host, strlen(host));
                eo += 9;
            }
            else if (strnicmp(fmt + eo, "proxyport", 9) == 0) {
                int port = conf_get_int(conf, CONF_proxy_port);
                put_fmt(buf, "%d", port);
                eo += 9;
            }
            else {
                /* we don't escape this, so send the % now, and
                 * don't advance eo, so that we'll consider the
                 * text immediately following the % as unescaped.
                 */
                put_byte(buf, '%');
            }
        }

        /* resume scanning for additional escapes after this one. */
        so = eo;
    }

    /* if there is any unescaped text at the end of the line, send it */
    if (eo != so) {
        put_data(buf, fmt + so, eo - so);
    }

    if (flags_out)
        *flags_out = flags;
    return strbuf_to_str(buf);
}